

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_for_of_start(JSContext *ctx,JSValue *sp,BOOL is_async)

{
  int iVar1;
  JSValue obj;
  JSValue JVar2;
  
  JVar2 = sp[-1];
  obj = JS_GetIterator(ctx,sp[-1],is_async);
  iVar1 = -1;
  if ((int)obj.tag != 6) {
    JS_FreeValue(ctx,JVar2);
    sp[-1] = obj;
    JVar2 = JS_GetPropertyInternal(ctx,obj,0x6a,obj,0);
    if ((int)JVar2.tag != 6) {
      *sp = JVar2;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static __exception int js_for_of_start(JSContext *ctx, JSValue *sp,
                                       BOOL is_async)
{
    JSValue op1, obj, method;
    op1 = sp[-1];
    obj = JS_GetIterator(ctx, op1, is_async);
    if (JS_IsException(obj))
        return -1;
    JS_FreeValue(ctx, op1);
    sp[-1] = obj;
    method = JS_GetProperty(ctx, obj, JS_ATOM_next);
    if (JS_IsException(method))
        return -1;
    sp[0] = method;
    return 0;
}